

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O0

void __thiscall
layer::Convolution2D::majWeight(Convolution2D *this,scalar learningRate,scalar add,scalar multi)

{
  longdouble *plVar1;
  int local_68;
  int local_64;
  int posXKernel;
  int posYKernel;
  int posZKernel;
  int posXOut;
  int posYOut;
  int posZOut;
  int posYIn;
  int posXIn;
  scalar multi_local;
  scalar add_local;
  scalar learningRate_local;
  Convolution2D *this_local;
  
  for (posXOut = 0; posXOut < (this->super_Layer)._sizeZOut; posXOut = posXOut + 1) {
    for (posZKernel = 0; posZKernel < (this->super_Layer)._sizeYOut; posZKernel = posZKernel + 1) {
      for (posYKernel = 0; posYKernel < (this->super_Layer)._sizeXOut; posYKernel = posYKernel + 1)
      {
        for (posXKernel = 0; posXKernel < (this->super_Layer)._sizeZWeight;
            posXKernel = posXKernel + 1) {
          posYOut = posZKernel * this->_stepY - this->_zeroPaddingY;
          for (local_64 = 0; local_64 < (this->super_Layer)._sizeYWeight; local_64 = local_64 + 1) {
            if (-1 < posYOut && posYOut < this->_sizeYIn) {
              posZOut = posYKernel * this->_stepX - this->_zeroPaddingX;
              for (local_68 = 0; local_68 < (this->super_Layer)._sizeXWeight;
                  local_68 = local_68 + 1) {
                if (-1 < posZOut && posZOut < this->_sizeYIn) {
                  plVar1 = (this->super_Layer)._ptrWeight[posXOut][posXKernel][local_64];
                  plVar1[local_68] =
                       plVar1[local_68] +
                       (this->super_Layer)._in[posXKernel][posYOut][posZOut] *
                       (this->super_Layer)._delta[posXOut][posZKernel][posYKernel] *
                       learningRate._0_10_ * multi._0_10_ + add._0_10_;
                }
                posZOut = posZOut + 1;
              }
            }
            posYOut = posYOut + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Convolution2D::majWeight(type::scalar learningRate, type::scalar add, type::scalar multi)
    {

        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] +=
                                                (learningRate * _delta[posZOut][posYOut][posXOut] *
                                                 _in[posZKernel][posYIn][posXIn] * multi) + add;
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                }
            }
        }

    }